

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

int __thiscall CCEXP::CCEXPMat<unsigned_char>::StoreData(CCEXPMat<unsigned_char> *this,FILE *fp)

{
  uint64_t __size;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pMVar5;
  uchar *__ptr;
  size_t sVar6;
  size_t index_;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 local_138 [8];
  MVECTOR<unsigned_char> n_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
  *__range3_1;
  MVECTOR<unsigned_char> n;
  iterator __end0;
  iterator __begin0;
  vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
  *__range3;
  int i;
  undefined1 local_78 [8];
  MVECTOR<unsigned_long> DPL;
  uint64_t _maxRows64;
  uint64_t typeSize;
  uint64_t N;
  FILE *fp_local;
  CCEXPMat<unsigned_char> *this_local;
  
  if ((this->IgnoreM & 1U) == 0) {
    N = (uint64_t)fp;
    fp_local = (FILE *)this;
    if (fp == (FILE *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x5c);
        if (pcVar2 == (char *)0x0) {
          local_150 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
          ;
        }
        else {
          local_150 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                              ,0x5c);
          local_150 = local_150 + 1;
        }
        local_148 = local_150;
      }
      else {
        local_148 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                            ,0x2f);
        local_148 = local_148 + 1;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,local_148,0x1a0,
                     "CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");
      this_local._4_4_ = -9999;
    }
    else {
      typeSize = std::
                 vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                 ::size(&this->data);
      _maxRows64 = 1;
      DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->_maxRows;
      fwrite(this->name,1,0x40,(FILE *)N);
      fwrite(this->type,1,0x40,(FILE *)N);
      fwrite(&_maxRows64,8,1,(FILE *)N);
      fwrite(&typeSize,8,1,(FILE *)N);
      fwrite(&DPL.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,8,1
             ,(FILE *)N);
      if (this->_maxRows < typeSize) {
        typeSize = this->_maxRows;
      }
      sVar3 = std::
              vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
              ::size(&this->data);
      if (typeSize < sVar3) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
          if (pcVar2 == (char *)0x0) {
            local_160 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
            ;
          }
          else {
            local_160 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                ,0x5c);
            local_160 = local_160 + 1;
          }
          local_158 = local_160;
        }
        else {
          local_158 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                              ,0x2f);
          local_158 = local_158 + 1;
        }
        sVar3 = std::
                vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                ::size(&this->data);
        CECS::RecError((CECS *)CCEXPECS,-9999,1,local_158,0x1af,
                       "CCEXPMat::StoreData():: Table [%s] containing more Rows (=%zu) than MaxRows (=%zu)"
                       ,this->name,sVar3,this->_maxRows);
        fclose((FILE *)N);
        this_local._4_4_ = -9999;
      }
      else {
        if (typeSize != 0) {
          ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR((MVECTOR<unsigned_long> *)local_78);
          ns_MVECTOR::MVECTOR<unsigned_long>::resize((MVECTOR<unsigned_long> *)local_78,typeSize);
          __range3._0_4_ = 0;
          __end0 = std::
                   vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ::begin(&this->data);
          n.sptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
               ::end(&this->data);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end0,(__normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
                                        *)&n.sptr.
                                           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
            if (!bVar1) break;
            pMVar5 = __gnu_cxx::
                     __normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
                     ::operator*(&__end0);
            ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR
                      ((MVECTOR<unsigned_char> *)&__range3_1,pMVar5);
            sVar6 = ns_MVECTOR::MVECTOR<unsigned_char>::size((MVECTOR<unsigned_char> *)&__range3_1);
            index_ = (size_t)(int)__range3;
            __range3._0_4_ = (int)__range3 + 1;
            puVar4 = ns_MVECTOR::MVECTOR<unsigned_long>::operator[]
                               ((MVECTOR<unsigned_long> *)local_78,index_);
            *puVar4 = sVar6;
            ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR((MVECTOR<unsigned_char> *)&__range3_1);
            __gnu_cxx::
            __normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
            ::operator++(&__end0);
          }
          puVar4 = ns_MVECTOR::MVECTOR<unsigned_long>::data((MVECTOR<unsigned_long> *)local_78);
          fwrite(puVar4,8,typeSize,(FILE *)N);
          ns_MVECTOR::MVECTOR<unsigned_long>::clear((MVECTOR<unsigned_long> *)local_78);
          __end0_1 = std::
                     vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                     ::begin(&this->data);
          n_1.sptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
               ::end(&this->data);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end0_1,
                               (__normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
                                *)&n_1.sptr.
                                   super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
            if (!bVar1) break;
            pMVar5 = __gnu_cxx::
                     __normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
                     ::operator*(&__end0_1);
            ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR((MVECTOR<unsigned_char> *)local_138,pMVar5);
            __ptr = ns_MVECTOR::MVECTOR<unsigned_char>::data((MVECTOR<unsigned_char> *)local_138);
            __size = _maxRows64;
            sVar6 = ns_MVECTOR::MVECTOR<unsigned_char>::size((MVECTOR<unsigned_char> *)local_138);
            fwrite(__ptr,__size,sVar6,(FILE *)N);
            ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR((MVECTOR<unsigned_char> *)local_138);
            __gnu_cxx::
            __normal_iterator<ns_MVECTOR::MVECTOR<unsigned_char>_*,_std::vector<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>_>
            ::operator++(&__end0_1);
          }
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR((MVECTOR<unsigned_long> *)local_78);
        }
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CCEXPMat<T>::StoreData(FILE* fp) {
	if (IgnoreM) return 0;
	CECS_ERRI(CCEXPECS,fp == NULL,"CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");

	uint64_t N = (uint64_t)data.size();
	uint64_t typeSize = (uint64_t)sizeof(T);
	uint64_t _maxRows64 = (uint64_t)_maxRows;

	fwrite(name,sizeof(char),64,fp); /// Table, Name
	fwrite(type,sizeof(char),64,fp); /// Table, Type (string)
	fwrite(&typeSize,sizeof(uint64_t),1,fp); /// Table, type size in Bytes
	fwrite(&N,sizeof(uint64_t),1,fp); /// Table, number of rows
	fwrite(&_maxRows64,sizeof(uint64_t),1,fp); /// Maximum rows of the table.
	if (N > _maxRows) N = _maxRows; /// Limit Rows ...

	CECS_ERRO(CCEXPECS,data.size() > N, {fclose(fp); return _CECS_DEFAULT_ERRID;},
			"CCEXPMat::StoreData():: Table [%s] containing more Rows (=" __ZU__ ") than MaxRows (=" __ZU__ ")",
			name, data.size(), _maxRows)

	if (N > 0) {
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		int i = 0;
		for (MVECTOR<T> n : data) DPL[i++] = (uint64_t)n.size();
		fwrite(DPL.data(), sizeof(uint64_t), N, fp);
		__CCEXP_VECTOR_CLEAR(DPL);
		for (MVECTOR<T> n : data) fwrite(n.data(), typeSize, n.size(), fp);
	}
	return 0;
}